

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtMapData::ConvertFromStruct(PsbtMapData *this,PsbtMapDataStruct *data)

{
  PsbtMapDataStruct *data_local;
  PsbtMapData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->key_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->value_,(string *)&data->value);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtMapData::ConvertFromStruct(
    const PsbtMapDataStruct& data) {
  key_ = data.key;
  value_ = data.value;
  ignore_items = data.ignore_items;
}